

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::
constraintsSecondPartialDerivativeWRTStateControlSparsity
          (OptimalControlProblem *this,SparsityStructure *stateControlSparsity)

{
  bool bVar1;
  element_type *peVar2;
  SparsityStructure *other;
  element_type *peVar3;
  char *pcVar4;
  long *in_RDI;
  ostringstream errorMsg;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>
  *groupPtr;
  iterator __end3;
  iterator __begin3;
  ConstraintsGroupsMap *__range3;
  iterator group;
  bool allHaveSparsity;
  SparsityStructure *in_stack_fffffffffffffdc8;
  ostringstream *this_00;
  SparsityStructure *in_stack_fffffffffffffdd0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
  *in_stack_fffffffffffffdd8;
  size_t in_stack_fffffffffffffde0;
  SparsityStructure *in_stack_fffffffffffffde8;
  undefined6 in_stack_fffffffffffffdf0;
  byte in_stack_fffffffffffffdf6;
  undefined1 uVar5;
  SparsityStructure *in_stack_fffffffffffffe00;
  ostringstream local_1d0 [376];
  reference local_58;
  _Self local_50;
  _Self local_48;
  long local_40;
  _Base_ptr local_38;
  _Self local_30;
  _Self local_28;
  byte local_19;
  byte local_1;
  
  local_19 = 1;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
                *)in_stack_fffffffffffffdc8);
  while( true ) {
    uVar5 = false;
    if ((local_19 & 1) != 0) {
      local_30._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
                  *)in_stack_fffffffffffffdc8);
      uVar5 = std::operator!=(&local_28,&local_30);
    }
    if ((bool)uVar5 == false) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
                  *)0x30354c);
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x303558);
    in_stack_fffffffffffffde8 =
         (SparsityStructure *)
         std::
         __shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x303560);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
                  *)0x303572);
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x30357e);
    in_stack_fffffffffffffdf6 =
         ConstraintsGroup::constraintsSecondPartialDerivativeWRTStateControlSparsity
                   ((ConstraintsGroup *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
                  *)0x3035a3);
    peVar2 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3035af);
    peVar2->hasMixedHessianSparsity = (bool)(in_stack_fffffffffffffdf6 & 1);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
                  *)0x3035c9);
    peVar2 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3035d5);
    local_19 = (local_19 & 1 & peVar2->hasMixedHessianSparsity & 1U) != 0;
    local_38 = (_Base_ptr)
               std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
               ::operator++(in_stack_fffffffffffffdd8,
                            (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
  }
  if ((local_19 & 1) == 0) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(*in_RDI + 0x18));
    if (!bVar1) {
      this_00 = local_1d0;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,
                      "Not all groups have the hessian sparsity defined and no dynamical system has been provided yet. Cannot determine the sparsity since both the state and the control dimensions are unknown."
                     );
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError
                ("OptimalControlProblem","constraintsSecondPartialDerivativeWRTStateControlSparsity"
                 ,pcVar4);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1d0);
      goto LAB_00303855;
    }
    SparsityStructure::clear(in_stack_fffffffffffffdd0);
    in_stack_fffffffffffffdd0 = (SparsityStructure *)(*in_RDI + 0x270);
    peVar3 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x303743);
    DynamicalSystem::stateSpaceSize(peVar3);
    peVar3 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x303764);
    DynamicalSystem::controlSpaceSize(peVar3);
    SparsityStructure::addDenseBlock
              (in_stack_fffffffffffffe00,(size_t)in_RDI,
               CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
               (size_t)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  }
  else {
    SparsityStructure::clear(in_stack_fffffffffffffdd0);
    local_40 = *in_RDI + 0x28;
    local_48._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
                  *)in_stack_fffffffffffffdc8);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
                *)in_stack_fffffffffffffdc8);
    while (bVar1 = std::operator!=(&local_48,&local_50), bVar1) {
      local_58 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
                 ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
                              *)0x3036a1);
      other = (SparsityStructure *)(*in_RDI + 0x270);
      std::
      __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3036d0);
      SparsityStructure::merge(in_stack_fffffffffffffde8,other);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
                    *)in_stack_fffffffffffffdd0);
    }
  }
  SparsityStructure::operator=(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  local_1 = 1;
LAB_00303855:
  return (bool)(local_1 & 1);
}

Assistant:

bool OptimalControlProblem::constraintsSecondPartialDerivativeWRTStateControlSparsity(SparsityStructure &stateControlSparsity)
        {
            bool allHaveSparsity = true;

            auto group = m_pimpl->constraintsGroups.begin();

            while (allHaveSparsity && group != m_pimpl->constraintsGroups.end()) {
                group->second->hasMixedHessianSparsity =
                    group->second->group_ptr->constraintsSecondPartialDerivativeWRTStateControlSparsity(group->second->mixedHessianSparsity);
                allHaveSparsity &= group->second->hasMixedHessianSparsity;
                group++;
            }

            if (allHaveSparsity) {
                m_pimpl->constraintsMixedHessianSparsity.clear();

                for (auto& groupPtr : m_pimpl->constraintsGroups) {
                    m_pimpl->constraintsMixedHessianSparsity.merge(groupPtr.second->mixedHessianSparsity);
                }

            } else {
                if (m_pimpl->dynamicalSystem) {
                    m_pimpl->constraintsMixedHessianSparsity.clear();
                    m_pimpl->constraintsMixedHessianSparsity.addDenseBlock(0, 0, m_pimpl->dynamicalSystem->stateSpaceSize(), m_pimpl->dynamicalSystem->controlSpaceSize());
                } else {
                    std::ostringstream errorMsg;
                    errorMsg << "Not all groups have the hessian sparsity defined and no dynamical system has been provided yet. Cannot determine the sparsity since both the state and the control dimensions are unknown.";
                    reportError("OptimalControlProblem", "constraintsSecondPartialDerivativeWRTStateControlSparsity", errorMsg.str().c_str());
                    return false;
                }
            }

            stateControlSparsity = m_pimpl->constraintsMixedHessianSparsity;
            return true;
        }